

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise::forward(ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob)

{
  bool bVar1;
  float *pfVar2;
  int iVar3;
  Mat *in_RSI;
  long in_RDI;
  float w_2;
  float val_1;
  int k_1;
  float *sptr_1;
  Mat m_1;
  int q;
  float *kptr_1;
  float sum_1;
  int j_2;
  int i_2;
  float *weight_data_ptr;
  float *outptr_1;
  int p;
  int g_1;
  int num_output_g;
  int channels_g;
  float w_1;
  float val;
  int k;
  float *sptr;
  float sum;
  int j_1;
  int i_1;
  Mat m;
  float *kptr;
  float *outptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  int hpad;
  int wpad;
  Mat bottom_blob_bordered;
  int kernel_extent_h;
  int kernel_extent_w;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  Mat *in_stack_fffffffffffffd78;
  allocator_type *in_stack_fffffffffffffd80;
  size_type in_stack_fffffffffffffd88;
  Mat *in_stack_fffffffffffffd90;
  float in_stack_fffffffffffffde4;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  int iVar4;
  undefined8 in_stack_fffffffffffffdf0;
  Mat *in_stack_fffffffffffffdf8;
  Mat *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe10;
  int local_1d4;
  float *local_1d0;
  float local_1c4;
  int local_1c0;
  int local_1bc;
  Mat local_1b0;
  float *local_180;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  float local_164;
  float local_160;
  int local_15c;
  float *local_158;
  float local_14c;
  int local_148;
  int local_144;
  Mat local_140;
  float *local_110;
  Mat local_108;
  float *local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  reference local_b8;
  vector<int,_std::allocator<int>_> local_a8;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined4 local_78;
  Mat local_68;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  local_24 = in_RSI->w;
  local_28 = in_RSI->h;
  local_2c = in_RSI->c;
  if ((local_2c % *(int *)(in_RDI + 0xac) != 0) ||
     (*(int *)(in_RDI + 0x80) % *(int *)(in_RDI + 0xac) != 0)) {
    return -100;
  }
  local_30 = *(int *)(in_RDI + 0x8c) * (*(int *)(in_RDI + 0x84) + -1) + 1;
  local_34 = *(int *)(in_RDI + 0x90) * (*(int *)(in_RDI + 0x88) + -1) + 1;
  Mat::Mat(&local_68,in_RSI);
  iVar3 = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
    if ((*(int *)(in_RDI + 0x9c) == -0xe9) && (*(int *)(in_RDI + 0xa0) == -0xe9)) {
      local_7c = (local_30 + ((local_24 + -1) / *(int *)(in_RDI + 0x94)) * *(int *)(in_RDI + 0x94))
                 - local_24;
      local_80 = (local_34 + ((local_28 + -1) / *(int *)(in_RDI + 0x98)) * *(int *)(in_RDI + 0x98))
                 - local_28;
      if ((0 < local_7c) || (0 < local_80)) {
        copy_make_border(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,iVar3,
                         (int)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffe10,
                         in_stack_fffffffffffffde4);
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        if (bVar1) {
          local_4 = -100;
          local_78 = 1;
          goto LAB_00155f67;
        }
      }
      local_24 = local_68.w;
      local_28 = local_68.h;
    }
  }
  else {
    copy_make_border(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,iVar3,
                     (int)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                     in_stack_fffffffffffffde8,in_stack_fffffffffffffe10,in_stack_fffffffffffffde4);
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    if (bVar1) {
      local_4 = -100;
      local_78 = 1;
      goto LAB_00155f67;
    }
    local_24 = local_68.w;
    local_28 = local_68.h;
  }
  local_84 = (local_24 - local_30) / *(int *)(in_RDI + 0x94) + 1;
  local_88 = (local_28 - local_34) / *(int *)(in_RDI + 0x98) + 1;
  Mat::create(in_stack_fffffffffffffd90,(int)(in_stack_fffffffffffffd88 >> 0x20),
              (int)in_stack_fffffffffffffd88,(int)((ulong)in_stack_fffffffffffffd80 >> 0x20),
              (size_t)in_stack_fffffffffffffd78);
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  if (bVar1) {
    local_4 = -100;
    local_78 = 1;
  }
  else {
    local_8c = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
    std::allocator<int>::allocator((allocator<int> *)0x1555ec);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::allocator<int>::~allocator((allocator<int> *)0x155612);
    local_b8 = std::vector<int,_std::allocator<int>_>::operator[](&local_a8,0);
    local_bc = 0;
    local_c0 = 0;
    local_c4 = local_24 * *(int *)(in_RDI + 0x90) -
               *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x8c);
    for (local_c8 = 0; local_c8 < *(int *)(in_RDI + 0x88); local_c8 = local_c8 + 1) {
      for (local_cc = 0; local_cc < *(int *)(in_RDI + 0x84); local_cc = local_cc + 1) {
        local_b8[local_bc] = local_c0;
        local_bc = local_bc + 1;
        local_c0 = *(int *)(in_RDI + 0x8c) + local_c0;
      }
      local_c0 = local_c4 + local_c0;
    }
    if ((local_2c == *(int *)(in_RDI + 0xac)) &&
       (*(int *)(in_RDI + 0xac) == *(int *)(in_RDI + 0x80))) {
      for (local_d0 = 0; local_d0 < *(int *)(in_RDI + 0xac); local_d0 = local_d0 + 1) {
        Mat::channel(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
        pfVar2 = Mat::operator_cast_to_float_(&local_108);
        Mat::~Mat((Mat *)0x1557e5);
        local_d8 = pfVar2;
        local_110 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xb0));
        local_110 = local_110 + local_8c * local_d0;
        Mat::channel(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
        for (local_144 = 0; local_144 < local_88; local_144 = local_144 + 1) {
          for (local_148 = 0; local_148 < local_84; local_148 = local_148 + 1) {
            local_14c = 0.0;
            if (*(int *)(in_RDI + 0xa4) != 0) {
              pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0xe0),local_d0);
              local_14c = *pfVar2;
            }
            local_158 = Mat::row(&local_140,local_144 * *(int *)(in_RDI + 0x98));
            local_158 = local_158 + local_148 * *(int *)(in_RDI + 0x94);
            for (local_15c = 0; local_15c < local_8c; local_15c = local_15c + 1) {
              local_160 = local_158[local_b8[local_15c]];
              local_164 = local_110[local_15c];
              local_14c = local_160 * local_164 + local_14c;
            }
            local_d8[local_148] = local_14c;
          }
          local_d8 = local_d8 + local_84;
        }
        Mat::~Mat((Mat *)0x155aad);
      }
    }
    else {
      local_168 = local_2c / *(int *)(in_RDI + 0xac);
      local_16c = *(int *)(in_RDI + 0x80) / *(int *)(in_RDI + 0xac);
      for (local_170 = 0; local_170 < *(int *)(in_RDI + 0xac); local_170 = local_170 + 1) {
        for (local_174 = 0; local_174 < local_16c; local_174 = local_174 + 1) {
          Mat::channel(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
          pfVar2 = Mat::operator_cast_to_float_(&local_1b0);
          Mat::~Mat((Mat *)0x155ba0);
          local_180 = pfVar2;
          pfVar2 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xb0));
          iVar3 = local_8c * local_168 * local_16c * local_170;
          for (local_1bc = 0; local_1bc < local_88; local_1bc = local_1bc + 1) {
            for (local_1c0 = 0; local_1c0 < local_84; local_1c0 = local_1c0 + 1) {
              local_1c4 = 0.0;
              if (*(int *)(in_RDI + 0xa4) != 0) {
                in_stack_fffffffffffffd80 =
                     (allocator_type *)
                     Mat::operator[]((Mat *)(in_RDI + 0xe0),local_16c * local_170 + local_174);
                local_1c4 = *(float *)in_stack_fffffffffffffd80;
              }
              local_1d0 = pfVar2 + (long)iVar3 + (long)(local_8c * local_168 * local_174);
              for (local_1d4 = 0; local_1d4 < local_168; local_1d4 = local_1d4 + 1) {
                Mat::channel(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
                in_stack_fffffffffffffd78 =
                     (Mat *)Mat::row((Mat *)&stack0xfffffffffffffdf8,
                                     local_1bc * *(int *)(in_RDI + 0x98));
                for (iVar4 = 0; iVar4 < local_8c; iVar4 = iVar4 + 1) {
                  local_1c4 = *(float *)((long)&in_stack_fffffffffffffd78->data +
                                        (long)local_b8[iVar4] * 4 +
                                        (long)(local_1c0 * *(int *)(in_RDI + 0x94)) * 4) *
                              local_1d0[iVar4] + local_1c4;
                }
                local_1d0 = local_1d0 + local_8c;
                Mat::~Mat((Mat *)0x155e82);
              }
              local_180[local_1c0] = local_1c4;
            }
            local_180 = local_180 + local_84;
          }
        }
      }
    }
    local_4 = 0;
    local_78 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
  }
LAB_00155f67:
  Mat::~Mat((Mat *)0x155f74);
  return local_4;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

#ifdef _WIN32
    #pragma omp parallel for
#else // _WIN32
    #pragma omp parallel for collapse(2)
#endif // _WIN32
    for (int g=0; g<group; g++)
    {
        for (int p=0; p<num_output_g; p++)
        {
            float* outptr = top_blob.channel(g * num_output_g + p);
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[num_output_g * g + p];

                    const float* kptr = weight_data_ptr + maxk * channels_g * p;

                    // channels_g
                    for (int q=0; q<channels_g; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }

    return 0;
}